

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264_stream.c
# Opt level: O0

void write_pic_parameter_set_rbsp(h264_stream_t *h,bs_t *b)

{
  pps_t *ppVar1;
  int n;
  int local_38;
  int i_1;
  int have_more_data;
  int v;
  int i;
  int i_group_1;
  int i_group;
  pps_t *pps;
  bs_t *b_local;
  h264_stream_t *h_local;
  
  ppVar1 = h->pps;
  bs_write_ue(b,ppVar1->pic_parameter_set_id);
  bs_write_ue(b,ppVar1->seq_parameter_set_id);
  bs_write_u1(b,ppVar1->entropy_coding_mode_flag);
  bs_write_u1(b,ppVar1->pic_order_present_flag);
  bs_write_ue(b,ppVar1->num_slice_groups_minus1);
  if (0 < ppVar1->num_slice_groups_minus1) {
    bs_write_ue(b,ppVar1->slice_group_map_type);
    if (ppVar1->slice_group_map_type == 0) {
      for (i = 0; i <= ppVar1->num_slice_groups_minus1; i = i + 1) {
        bs_write_ue(b,ppVar1->run_length_minus1[i]);
      }
    }
    else if (ppVar1->slice_group_map_type == 2) {
      for (v = 0; v < ppVar1->num_slice_groups_minus1; v = v + 1) {
        bs_write_ue(b,ppVar1->top_left[v]);
        bs_write_ue(b,ppVar1->bottom_right[v]);
      }
    }
    else if (((ppVar1->slice_group_map_type == 3) || (ppVar1->slice_group_map_type == 4)) ||
            (ppVar1->slice_group_map_type == 5)) {
      bs_write_u1(b,ppVar1->slice_group_change_direction_flag);
      bs_write_ue(b,ppVar1->slice_group_change_rate_minus1);
    }
    else if (ppVar1->slice_group_map_type == 6) {
      bs_write_ue(b,ppVar1->pic_size_in_map_units_minus1);
      for (have_more_data = 0; have_more_data <= ppVar1->pic_size_in_map_units_minus1;
          have_more_data = have_more_data + 1) {
        n = intlog2(ppVar1->num_slice_groups_minus1 + 1);
        bs_write_u(b,n,ppVar1->slice_group_id[have_more_data]);
      }
    }
  }
  bs_write_ue(b,ppVar1->num_ref_idx_l0_active_minus1);
  bs_write_ue(b,ppVar1->num_ref_idx_l1_active_minus1);
  bs_write_u1(b,ppVar1->weighted_pred_flag);
  bs_write_u(b,2,ppVar1->weighted_bipred_idc);
  bs_write_se(b,ppVar1->pic_init_qp_minus26);
  bs_write_se(b,ppVar1->pic_init_qs_minus26);
  bs_write_se(b,ppVar1->chroma_qp_index_offset);
  bs_write_u1(b,ppVar1->deblocking_filter_control_present_flag);
  bs_write_u1(b,ppVar1->constrained_intra_pred_flag);
  bs_write_u1(b,ppVar1->redundant_pic_cnt_present_flag);
  if ((ppVar1->transform_8x8_mode_flag != 0 || ppVar1->pic_scaling_matrix_present_flag != 0) ||
      ppVar1->second_chroma_qp_index_offset != 0) {
    bs_write_u1(b,ppVar1->transform_8x8_mode_flag);
    bs_write_u1(b,ppVar1->pic_scaling_matrix_present_flag);
    if (ppVar1->pic_scaling_matrix_present_flag != 0) {
      for (local_38 = 0; local_38 < ppVar1->transform_8x8_mode_flag * 2 + 6; local_38 = local_38 + 1
          ) {
        bs_write_u1(b,ppVar1->pic_scaling_list_present_flag[local_38]);
        if (ppVar1->pic_scaling_list_present_flag[local_38] != 0) {
          if (local_38 < 6) {
            write_scaling_list(b,ppVar1->ScalingList4x4[local_38],0x10,
                               ppVar1->UseDefaultScalingMatrix4x4Flag + local_38);
          }
          else {
            write_scaling_list(b,ppVar1->ScalingList8x8[local_38 + -6],0x40,
                               ppVar1->UseDefaultScalingMatrix8x8Flag + (local_38 + -6));
          }
        }
      }
    }
    bs_write_se(b,ppVar1->second_chroma_qp_index_offset);
  }
  return;
}

Assistant:

void write_pic_parameter_set_rbsp(h264_stream_t* h, bs_t* b)
{
    pps_t* pps = h->pps;
    if( 0 )
    {
        memset(pps, 0, sizeof(pps_t));
    }

    bs_write_ue(b, pps->pic_parameter_set_id);
    bs_write_ue(b, pps->seq_parameter_set_id);
    bs_write_u1(b, pps->entropy_coding_mode_flag);
    bs_write_u1(b, pps->pic_order_present_flag);
    bs_write_ue(b, pps->num_slice_groups_minus1);

    if( pps->num_slice_groups_minus1 > 0 )
    {
        bs_write_ue(b, pps->slice_group_map_type);
        if( pps->slice_group_map_type == 0 )
        {
            for( int i_group = 0; i_group <= pps->num_slice_groups_minus1; i_group++ )
            {
                bs_write_ue(b, pps->run_length_minus1[ i_group ]);
            }
        }
        else if( pps->slice_group_map_type == 2 )
        {
            for( int i_group = 0; i_group < pps->num_slice_groups_minus1; i_group++ )
            {
                bs_write_ue(b, pps->top_left[ i_group ]);
                bs_write_ue(b, pps->bottom_right[ i_group ]);
            }
        }
        else if( pps->slice_group_map_type == 3 ||
                 pps->slice_group_map_type == 4 ||
                 pps->slice_group_map_type == 5 )
        {
            bs_write_u1(b, pps->slice_group_change_direction_flag);
            bs_write_ue(b, pps->slice_group_change_rate_minus1);
        }
        else if( pps->slice_group_map_type == 6 )
        {
            bs_write_ue(b, pps->pic_size_in_map_units_minus1);
            for( int i = 0; i <= pps->pic_size_in_map_units_minus1; i++ )
            {
                int v = intlog2( pps->num_slice_groups_minus1 + 1 );
                bs_write_u(b, v, pps->slice_group_id[ i ]);
            }
        }
    }
    bs_write_ue(b, pps->num_ref_idx_l0_active_minus1);
    bs_write_ue(b, pps->num_ref_idx_l1_active_minus1);
    bs_write_u1(b, pps->weighted_pred_flag);
    bs_write_u(b, 2, pps->weighted_bipred_idc);
    bs_write_se(b, pps->pic_init_qp_minus26);
    bs_write_se(b, pps->pic_init_qs_minus26);
    bs_write_se(b, pps->chroma_qp_index_offset);
    bs_write_u1(b, pps->deblocking_filter_control_present_flag);
    bs_write_u1(b, pps->constrained_intra_pred_flag);
    bs_write_u1(b, pps->redundant_pic_cnt_present_flag);

    int have_more_data = 0;
    if( 0 ) { have_more_data = more_rbsp_data(b); }
    if( 1 )
    {
        have_more_data = pps->transform_8x8_mode_flag | pps->pic_scaling_matrix_present_flag | pps->second_chroma_qp_index_offset != 0;
    }

    if( have_more_data )
    {
        bs_write_u1(b, pps->transform_8x8_mode_flag);
        bs_write_u1(b, pps->pic_scaling_matrix_present_flag);
        if( pps->pic_scaling_matrix_present_flag )
        {
            for( int i = 0; i < 6 + 2* pps->transform_8x8_mode_flag; i++ )
            {
                bs_write_u1(b, pps->pic_scaling_list_present_flag[ i ]);
                if( pps->pic_scaling_list_present_flag[ i ] )
                {
                    if( i < 6 )
                    {
                        write_scaling_list( b, pps->ScalingList4x4[ i ], 16,
                                                 &( pps->UseDefaultScalingMatrix4x4Flag[ i ] ) );
                    }
                    else
                    {
                        write_scaling_list( b, pps->ScalingList8x8[ i - 6 ], 64,
                                                 &( pps->UseDefaultScalingMatrix8x8Flag[ i - 6 ] ) );
                    }
                }
            }
        }
        bs_write_se(b, pps->second_chroma_qp_index_offset);
    }

    if( 0 )
    {
        memcpy(h->pps_table[pps->pic_parameter_set_id], h->pps, sizeof(pps_t));
    }
}